

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_utils.h
# Opt level: O2

void __thiscall BitWriter::WriteInner<32,unsigned_int>(BitWriter *this,uint val)

{
  long lVar1;
  byte *pbVar2;
  uchar *puVar3;
  int iVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->offset < -0x18) {
    iVar4 = 0x20;
  }
  else {
    pbVar2 = this->out;
    this->out = pbVar2 + 1;
    *pbVar2 = (byte)(val << ((byte)this->offset & 0x1f)) | this->state;
    val = val >> (8U - (char)this->offset & 0x1f);
    iVar4 = this->offset + 0x18;
    this->offset = 0;
    this->state = '\0';
  }
  for (; 7 < iVar4; iVar4 = iVar4 + -8) {
    puVar3 = this->out;
    this->out = puVar3 + 1;
    *puVar3 = (uchar)val;
    val = val >> 8;
  }
  this->state = this->state |
                (byte)((val & ~(-1 << ((byte)iVar4 & 0x1f))) << ((byte)this->offset & 0x1f));
  this->offset = this->offset + iVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void WriteInner(I val) {
        // We right shift by up to 8 bits below. Verify that's well defined for the type I.
        static_assert(std::numeric_limits<I>::digits > 8, "BitWriter::WriteInner needs I > 8 bits");
        int bits = BITS;
        if (bits + offset >= 8) {
            state |= ((val & ((I(1) << (8 - offset)) - 1)) << offset);
            *(out++) = state;
            val >>= (8 - offset);
            bits -= 8 - offset;
            offset = 0;
            state = 0;
        }
        while (bits >= 8) {
            *(out++) = val & 255;
            val >>= 8;
            bits -= 8;
        }
        state |= ((val & ((I(1) << bits) - 1)) << offset);
        offset += bits;
    }